

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_7::Validator::CheckGlobalVar
          (Validator *this,Var *var,Global **out_global,Index *out_global_index)

{
  Result RVar1;
  Enum EVar2;
  undefined8 in_RAX;
  uint local_24 [2];
  Index index;
  
  local_24[0] = (uint)((ulong)in_RAX >> 0x20);
  RVar1 = CheckVar(this,(Index)((ulong)((long)(this->current_module_->globals).
                                              super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->current_module_->globals).
                                             super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3),var,
                   "global",local_24);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    if (out_global != (Global **)0x0) {
      *out_global = (this->current_module_->globals).
                    super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                    super__Vector_impl_data._M_start[local_24[0]];
    }
    EVar2 = Ok;
    if (out_global_index != (Index *)0x0) {
      *out_global_index = local_24[0];
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result Validator::CheckGlobalVar(const Var* var,
                                 const Global** out_global,
                                 Index* out_global_index) {
  Index index;
  CHECK_RESULT(
      CheckVar(current_module_->globals.size(), var, "global", &index));
  if (out_global) {
    *out_global = current_module_->globals[index];
  }
  if (out_global_index) {
    *out_global_index = index;
  }
  return Result::Ok;
}